

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

spv_result_t
spvtools::val::ValidateBinaryAndKeepValidationState
          (spv_const_context context,spv_const_validator_options options,uint32_t *words,
          size_t num_words,spv_diagnostic *pDiagnostic,
          unique_ptr<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
          *vstate)

{
  _Invoker_type this;
  spv_result_t sVar1;
  ValidationState_t *this_00;
  pointer vstate_00;
  undefined1 local_78 [8];
  spv_context_t hijack_context;
  unique_ptr<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
  *vstate_local;
  spv_diagnostic *pDiagnostic_local;
  size_t num_words_local;
  uint32_t *words_local;
  spv_const_validator_options options_local;
  spv_const_context context_local;
  
  hijack_context.consumer._M_invoker = (_Invoker_type)vstate;
  spv_context_t::spv_context_t((spv_context_t *)local_78,context);
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    UseDiagnosticAsMessageConsumer((spv_context)local_78,pDiagnostic);
  }
  this = hijack_context.consumer._M_invoker;
  this_00 = (ValidationState_t *)operator_new(0x6b8);
  ValidationState_t::ValidationState_t
            (this_00,(spv_const_context)local_78,options,words,num_words,
             ::(anonymous_namespace)::kDefaultMaxNumOfWarnings);
  std::
  unique_ptr<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
  ::reset((unique_ptr<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
           *)this,this_00);
  vstate_00 = std::
              unique_ptr<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
              ::get((unique_ptr<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
                     *)hijack_context.consumer._M_invoker);
  sVar1 = anon_unknown_2::ValidateBinaryUsingContextAndValidationState
                    ((spv_context_t *)local_78,words,num_words,pDiagnostic,vstate_00);
  spv_context_t::~spv_context_t((spv_context_t *)local_78);
  return sVar1;
}

Assistant:

spv_result_t ValidateBinaryAndKeepValidationState(
    const spv_const_context context, spv_const_validator_options options,
    const uint32_t* words, const size_t num_words, spv_diagnostic* pDiagnostic,
    std::unique_ptr<ValidationState_t>* vstate) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  vstate->reset(new ValidationState_t(&hijack_context, options, words,
                                      num_words, kDefaultMaxNumOfWarnings));

  return ValidateBinaryUsingContextAndValidationState(
      hijack_context, words, num_words, pDiagnostic, vstate->get());
}